

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  undefined8 uVar4;
  char *in_RDX;
  long in_FS_OFFSET;
  char *string_value;
  char *flag_local;
  Message local_68;
  Message local_60;
  Int32 local_58;
  Int32 local_54;
  Int32 result;
  Int32 default_value_local;
  undefined1 local_30 [8];
  string env_var;
  
  env_var.field_2._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_54 = default_value;
  FlagToEnvVar_abi_cxx11_((string *)local_30,(internal *)flag,in_RDX);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar2 = posix::GetEnv(pcVar2);
  if (pcVar2 == (char *)0x0) {
    flag_local._4_4_ = local_54;
  }
  else {
    local_58 = local_54;
    Message::Message(&local_60);
    pMVar3 = Message::operator<<(&local_60,(char (*) [22])"Environment variable ");
    pMVar3 = Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_30);
    bVar1 = ParseInt32(pMVar3,pcVar2,&local_58);
    Message::~Message(&local_60);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      flag_local._4_4_ = local_58;
    }
    else {
      Message::Message(&local_68);
      pMVar3 = Message::operator<<(&local_68,&local_54);
      Message::GetString_abi_cxx11_((string *)&result,pMVar3);
      uVar4 = std::__cxx11::string::c_str();
      printf("The default value %s is used.\n",uVar4);
      std::__cxx11::string::~string((string *)&result);
      Message::~Message(&local_68);
      fflush(_stdout);
      flag_local._4_4_ = local_54;
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == env_var.field_2._8_8_) {
    return flag_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
#if defined(GTEST_GET_INT32_FROM_ENV_)
  return GTEST_GET_INT32_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
#endif  // defined(GTEST_GET_INT32_FROM_ENV_)
}